

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

int abs(int __x)

{
  pointer *this;
  bool bVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  undefined4 in_register_0000003c;
  vector<Blade,_std::allocator<Blade>_> *__x_00;
  double __x_01;
  vector<Blade,_std::allocator<Blade>_> local_f0;
  vector<Blade,_std::allocator<Blade>_> local_d8;
  vector<Blade,_std::allocator<Blade>_> local_c0;
  undefined1 local_a8 [8];
  Clifford temp;
  undefined1 local_78 [8];
  Clifford xb;
  vector<Blade,_std::allocator<Blade>_> local_50;
  vector<Blade,_std::allocator<Blade>_> local_38;
  float local_1c;
  vector<Blade,_std::allocator<Blade>_> *pvStack_18;
  float sk;
  Clifford *A_local;
  
  __x_00 = (vector<Blade,_std::allocator<Blade>_> *)CONCAT44(in_register_0000003c,__x);
  pvStack_18 = __x_00;
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_38,__x_00);
  operator<=(&local_1c,&local_38);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_38);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_50,__x_00);
  bVar1 = isScalar(&local_50);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_50);
  if (bVar1) {
    __x_01 = std::fabs((double)(ulong)(uint)local_1c);
    std::sqrt(__x_01);
    iVar2 = extraout_EAX;
  }
  else {
    this = &temp.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage;
    std::vector<Blade,_std::allocator<Blade>_>::vector
              ((vector<Blade,_std::allocator<Blade>_> *)this,__x_00);
    operator!((Clifford *)local_78,(Clifford *)this);
    std::vector<Blade,_std::allocator<Blade>_>::~vector
              ((vector<Blade,_std::allocator<Blade>_> *)
               &temp.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_c0,__x_00);
    std::vector<Blade,_std::allocator<Blade>_>::vector
              (&local_d8,(vector<Blade,_std::allocator<Blade>_> *)local_78);
    operator|((Clifford *)local_a8,&local_c0,&local_d8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c0);
    std::vector<Blade,_std::allocator<Blade>_>::vector
              (&local_f0,(vector<Blade,_std::allocator<Blade>_> *)local_a8);
    abs((int)&local_f0);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_f0);
    std::vector<Blade,_std::allocator<Blade>_>::~vector
              ((vector<Blade,_std::allocator<Blade>_> *)local_a8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector
              ((vector<Blade,_std::allocator<Blade>_> *)local_78);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

float abs(Clifford A)
{
	float sk; sk<=A;

	if(isScalar(A))
	{
		return sqrt(fabs(sk));
	}

	Clifford xb = !A;
	Clifford temp = A|xb;
	return abs(temp);


}